

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garbage_collection.cpp
# Opt level: O3

void scm::mark(Environment *env)

{
  Verbosity VVar1;
  _Rb_tree_node_base *p_Var2;
  Object *obj;
  double __x;
  string local_50;
  
  for (p_Var2 = (env->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(env->bindings)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    VVar1 = loguru::current_verbosity_cutoff();
    if ((-1 < VVar1) && (LOG_GARBAGE_COLLECTION != '\0')) {
      toString_abi_cxx11_(&local_50,*(scm **)(p_Var2 + 2),obj);
      loguru::log(__x);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    markSchemeObject(*(Object **)(p_Var2 + 2));
  }
  return;
}

Assistant:

void mark(Environment& env)
{
  for (auto& binding : env.bindings) {
    DLOG_IF_F(INFO,
              LOG_GARBAGE_COLLECTION,
              "marking binding %s | %s",
              binding.first.c_str(),
              toString(binding.second).c_str());
    markSchemeObject(binding.second);
  }
}